

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tty.c
# Opt level: O3

int run_test_tty_pty(void)

{
  int iVar1;
  undefined8 uVar2;
  undefined1 *puVar3;
  int slave_fd;
  int master_fd;
  winsize w;
  uv_tty_t slave_tty;
  uv_tty_t master_tty;
  uv_loop_t loop;
  uint local_5e0;
  uint local_5dc;
  undefined1 local_5d8 [8];
  undefined1 local_5d0 [90];
  byte local_576;
  undefined1 local_498 [90];
  byte local_43e;
  undefined1 local_360 [848];
  
  puVar3 = local_360;
  iVar1 = uv_loop_init(puVar3);
  if (iVar1 == 0) {
    iVar1 = openpty(&local_5dc,&local_5e0,0,0,local_5d8);
    if (iVar1 != 0) {
      run_test_tty_pty_cold_2();
      return 1;
    }
    puVar3 = local_360;
    iVar1 = uv_tty_init(puVar3,local_5d0,local_5e0,0);
    if (iVar1 != 0) goto LAB_001865f8;
    puVar3 = local_360;
    iVar1 = uv_tty_init(puVar3,local_498,local_5dc,0);
    if (iVar1 != 0) goto LAB_001865fd;
    puVar3 = local_5d0;
    iVar1 = uv_is_readable(puVar3);
    if (iVar1 == 0) goto LAB_00186602;
    puVar3 = local_5d0;
    iVar1 = uv_is_writable(puVar3);
    if (iVar1 == 0) goto LAB_00186607;
    puVar3 = local_498;
    iVar1 = uv_is_readable(puVar3);
    if (iVar1 == 0) goto LAB_0018660c;
    puVar3 = local_498;
    iVar1 = uv_is_writable(puVar3);
    if (iVar1 == 0) goto LAB_00186611;
    if ((local_576 & 0x10) != 0) goto LAB_00186616;
    if ((local_43e & 0x10) == 0) goto LAB_0018661b;
    puVar3 = (undefined1 *)(ulong)local_5e0;
    iVar1 = close(local_5e0);
    if (iVar1 != 0) goto LAB_00186620;
    uv_close(local_5d0,0);
    puVar3 = (undefined1 *)(ulong)local_5dc;
    iVar1 = close(local_5dc);
    if (iVar1 != 0) goto LAB_00186625;
    uv_close(local_498,0);
    puVar3 = local_360;
    iVar1 = uv_run(puVar3,0);
    if (iVar1 == 0) {
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      puVar3 = (undefined1 *)uv_default_loop();
      iVar1 = uv_loop_close(puVar3);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_0018662f;
    }
  }
  else {
    run_test_tty_pty_cold_1();
LAB_001865f8:
    run_test_tty_pty_cold_3();
LAB_001865fd:
    run_test_tty_pty_cold_4();
LAB_00186602:
    run_test_tty_pty_cold_14();
LAB_00186607:
    run_test_tty_pty_cold_13();
LAB_0018660c:
    run_test_tty_pty_cold_12();
LAB_00186611:
    run_test_tty_pty_cold_11();
LAB_00186616:
    run_test_tty_pty_cold_5();
LAB_0018661b:
    run_test_tty_pty_cold_10();
LAB_00186620:
    run_test_tty_pty_cold_6();
LAB_00186625:
    run_test_tty_pty_cold_7();
  }
  run_test_tty_pty_cold_8();
LAB_0018662f:
  run_test_tty_pty_cold_9();
  iVar1 = uv_is_closing();
  if (iVar1 == 0) {
    iVar1 = uv_close(puVar3,0);
    return iVar1;
  }
  return iVar1;
}

Assistant:

TEST_IMPL(tty_pty) {
/* TODO(gengjiawen): Fix test on QEMU. */
#if defined(__QEMU__)
  RETURN_SKIP("Test does not currently work in QEMU");
#endif
#if defined(__ASAN__)
  RETURN_SKIP("Test does not currently work in ASAN");
#endif

#if defined(__APPLE__)                            || \
    defined(__DragonFly__)                        || \
    defined(__FreeBSD__)                          || \
    defined(__FreeBSD_kernel__)                   || \
    (defined(__linux__) && !defined(__ANDROID__)) || \
    defined(__NetBSD__)                           || \
    defined(__OpenBSD__)
  int master_fd, slave_fd, r;
  struct winsize w;
  uv_loop_t loop;
  uv_tty_t master_tty, slave_tty;

  ASSERT(0 == uv_loop_init(&loop));

  r = openpty(&master_fd, &slave_fd, NULL, NULL, &w);
  if (r != 0)
    RETURN_SKIP("No pty available, skipping.");

  ASSERT(0 == uv_tty_init(&loop, &slave_tty, slave_fd, 0));
  ASSERT(0 == uv_tty_init(&loop, &master_tty, master_fd, 0));
  ASSERT(uv_is_readable((uv_stream_t*) &slave_tty));
  ASSERT(uv_is_writable((uv_stream_t*) &slave_tty));
  ASSERT(uv_is_readable((uv_stream_t*) &master_tty));
  ASSERT(uv_is_writable((uv_stream_t*) &master_tty));
  /* Check if the file descriptor was reopened. If it is,
   * UV_HANDLE_BLOCKING_WRITES (value 0x100000) isn't set on flags.
   */
  ASSERT(0 == (slave_tty.flags & 0x100000));
  /* The master_fd of a pty should never be reopened.
   */
  ASSERT(master_tty.flags & 0x100000);
  ASSERT(0 == close(slave_fd));
  uv_close((uv_handle_t*) &slave_tty, NULL);
  ASSERT(0 == close(master_fd));
  uv_close((uv_handle_t*) &master_tty, NULL);

  ASSERT(0 == uv_run(&loop, UV_RUN_DEFAULT));

  MAKE_VALGRIND_HAPPY();
#endif
  return 0;
}